

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

string * __thiscall
gvr::(anonymous_namespace)::PLYProperty::toString_abi_cxx11_
          (string *__return_storage_ptr__,PLYProperty *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  string *extraout_RAX;
  string *psVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_type *psVar10;
  ply_type in_EDX;
  undefined8 uVar11;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  long local_98;
  long lStack_90;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  if (*(uint *)(this + 0x28) == 0) {
    type2Name_abi_cxx11_(&local_c8,(PLYProperty *)(ulong)*(uint *)(this + 0x2c),in_EDX);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x12760e);
    puVar8 = puVar5 + 2;
    if ((undefined8 *)*puVar5 == puVar8) {
      local_d8 = *puVar8;
      uStack_d0 = puVar5[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar8;
      local_e8 = (undefined8 *)*puVar5;
    }
    local_e0 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_98 = *plVar4;
      lStack_90 = puVar5[3];
      local_a8._M_allocated_capacity = (size_type)&local_98;
    }
    else {
      local_98 = *plVar4;
      local_a8._M_allocated_capacity = (size_type)(long *)*puVar5;
    }
    local_a8._8_8_ = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append(local_a8._M_local_buf,*(ulong *)(this + 8));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar10) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((long *)local_a8._M_allocated_capacity != &local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    psVar6 = &local_c8;
    goto LAB_0010f696;
  }
  type2Name_abi_cxx11_(&local_48,(PLYProperty *)(ulong)*(uint *)(this + 0x28),in_EDX);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x127618);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_58 = *plVar7;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar7;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  paVar1 = &local_c8.field_2;
  puVar9 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_c8.field_2._M_allocated_capacity = *puVar9;
    local_c8.field_2._8_8_ = plVar4[3];
    local_c8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *puVar9;
    local_c8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_c8._M_string_length = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  type2Name_abi_cxx11_
            (&local_88,(PLYProperty *)(ulong)*(uint *)(this + 0x2c),
             (ply_type)local_c8._M_string_length);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    uVar11 = local_c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_88._M_string_length + local_c8._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar11 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_88._M_string_length + local_c8._M_string_length) goto LAB_0010f446;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_88,0,(char *)0x0,(ulong)local_c8._M_dataplus._M_p);
  }
  else {
LAB_0010f446:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88._M_dataplus._M_p);
  }
  local_e8 = &local_d8;
  puVar8 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar8) {
    local_d8 = *puVar8;
    uStack_d0 = puVar5[3];
  }
  else {
    local_d8 = *puVar8;
    local_e8 = (undefined8 *)*puVar5;
  }
  local_e0 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_98 = *plVar7;
    lStack_90 = plVar4[3];
    local_a8._M_allocated_capacity = (size_type)&local_98;
  }
  else {
    local_98 = *plVar7;
    local_a8._M_allocated_capacity = (size_type)(long *)*plVar4;
  }
  local_a8._8_8_ = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append(local_a8._M_local_buf,*(ulong *)(this + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar10) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((long *)local_a8._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  psVar6 = &local_48;
LAB_0010f696:
  psVar6 = (string *)&psVar6->field_2;
  _Var2._M_p = (((string *)((long)psVar6 + -0x10))->_M_dataplus)._M_p;
  if ((string *)_Var2._M_p != psVar6) {
    operator_delete(_Var2._M_p);
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

std::string PLYProperty::toString() const
{
  if (tsize == ply_none)
  {
    return "property "+type2Name(tvalue)+" "+name;
  }
  else
  {
    return "property list "+type2Name(tsize)+" "+type2Name(tvalue)+" "+name;
  }
}